

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool set_nearby_dic_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  char **d;
  char **ppcVar2;
  char temp [260];
  char parent [260];
  char acStack_238 [272];
  char local_128 [264];
  
  if (path == (char *)0x0 || oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (*path == '\0') {
    return false;
  }
  memset(acStack_238,0,0x104);
  ppcVar2 = G_DEFAULT_DIC_DIR_NAMES;
  while (*ppcVar2 != (char *)0x0) {
    _Var1 = search_directory(path,*ppcVar2,acStack_238);
    ppcVar2 = ppcVar2 + 1;
    if (_Var1) goto LAB_00149ddf;
  }
  get_dir(path,local_128);
  if (local_128[0] == '\0') {
    return false;
  }
  ppcVar2 = G_DEFAULT_DIC_DIR_NAMES;
  do {
    if (*ppcVar2 == (char *)0x0) {
      return false;
    }
    _Var1 = search_directory(local_128,*ppcVar2,acStack_238);
    ppcVar2 = ppcVar2 + 1;
  } while (!_Var1);
LAB_00149ddf:
  _Var1 = check_dic_utf_8(acStack_238);
  if (!_Var1) {
    return false;
  }
  strcpy(oj->dn_dic_path,acStack_238);
  Open_JTalk_load_dic(oj->open_jtalk,acStack_238);
  return true;
}

Assistant:

bool set_nearby_dic_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 指定位置から可能性のある名前を探す
	for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
	{
		if (search_directory(path, *d, temp))
		{
			goto check_charset;
		}
	}

	// その親ディレクトリから可能性のあるフォルダを探す
	char parent[MAX_PATH];
	get_dir_path(path, parent);
	if (parent != NULL && strlen(parent) != 0)
	{
		for (const char **d = G_DEFAULT_DIC_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(parent, *d, temp))
			{
				goto check_charset;
			}
		}
	}
	return false;

check_charset:
	if (!check_dic_utf_8(temp))
	{
		return false;
	}
	strcpy(oj->dn_dic_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_dic(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_dic(oj->open_jtalk, temp);
#endif

	return true;
}